

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

bool __thiscall capnp::anon_unknown_79::Input::tryConsume(Input *this,char expected)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  bool found;
  char expected_local;
  Input *this_local;
  
  bVar1 = exhausted(this);
  bVar3 = false;
  if (!bVar1) {
    cVar2 = nextChar(this);
    bVar3 = cVar2 == expected;
  }
  if (bVar3) {
    advance(this,1);
  }
  return bVar3;
}

Assistant:

bool tryConsume(char expected) {
    bool found = !exhausted() && nextChar() == expected;
    if (found) { advance(); }

    return found;
  }